

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  distance_comparison_task_params *pParams;
  uint uVar5;
  ulong uVar6;
  uint i;
  long lVar7;
  float dist2;
  float fVar8;
  float dist2_1;
  float fVar9;
  float fVar10;
  
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  uVar6 = (ulong)(uint)(*(int *)((long)pData_ptr + 0x14) - iVar1);
  uVar5 = (int)((uVar6 * data) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  uVar4 = (int)(((data + 1) * uVar6) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  if (uVar5 < uVar4) {
    lVar2 = *pData_ptr;
    lVar3 = *(long *)((long)pData_ptr + 8);
    uVar6 = (ulong)uVar5;
    do {
      uVar5 = (this->m_vectorsInfo).m_p[uVar6].index;
      fVar8 = 0.0;
      lVar7 = 0;
      do {
        fVar9 = *(float *)(lVar2 + lVar7 * 4) - this->m_vectors[uVar5].m_s[lVar7];
        fVar8 = fVar8 + fVar9 * fVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      fVar9 = 0.0;
      lVar7 = 0;
      do {
        fVar10 = *(float *)(lVar3 + lVar7 * 4) - this->m_vectors[uVar5].m_s[lVar7];
        fVar9 = fVar9 + fVar10 * fVar10;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      (this->m_vectorComparison).m_p[uVar6] = fVar8 < fVar9;
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr) {
    distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
    const VectorType& left_child = *pParams->left_child;
    const VectorType& right_child = *pParams->right_child;
    uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
    uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
    for (uint i = begin; i < end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      m_vectorComparison[i] = left_dist2 < right_dist2;
    }
  }